

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

ostream * __thiscall wasm::String::printEscaped(String *this,ostream *os,string_view str)

{
  ostream oVar1;
  ostream *this_00;
  void *this_01;
  long *plVar2;
  char *pcVar3;
  ostream *poVar4;
  
  std::operator<<((ostream *)this,'\"');
  poVar4 = (ostream *)0x0;
  do {
    if (os == poVar4) {
      poVar4 = std::operator<<((ostream *)this,'\"');
      return poVar4;
    }
    oVar1 = poVar4[str._M_len];
    if (oVar1 == (ostream)0x5c) {
      pcVar3 = "\\\\";
LAB_00c9135f:
      std::operator<<((ostream *)this,pcVar3);
    }
    else {
      if (oVar1 == (ostream)0xa) {
        pcVar3 = "\\n";
        goto LAB_00c9135f;
      }
      if (oVar1 == (ostream)0xd) {
        pcVar3 = "\\r";
        goto LAB_00c9135f;
      }
      if (oVar1 == (ostream)0x22) {
        pcVar3 = "\\\"";
        goto LAB_00c9135f;
      }
      if (oVar1 == (ostream)0x27) {
        pcVar3 = "\\\'";
        goto LAB_00c9135f;
      }
      if (oVar1 == (ostream)0x9) {
        pcVar3 = "\\t";
        goto LAB_00c9135f;
      }
      if ((byte)((char)oVar1 - 0x20U) < 0x5f) {
        std::operator<<((ostream *)this,(char)oVar1);
      }
      else {
        *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
             *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 8;
        this_00 = std::operator<<((ostream *)this,'\\');
        this_01 = (void *)std::ostream::operator<<(this_00,(uint)((byte)oVar1 >> 4));
        plVar2 = (long *)std::ostream::operator<<(this_01,(byte)oVar1 & 0xf);
        *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) =
             *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      }
    }
    poVar4 = poVar4 + 1;
  } while( true );
}

Assistant:

std::ostream& printEscaped(std::ostream& os, std::string_view str) {
  os << '"';
  for (unsigned char c : str) {
    switch (c) {
      case '\t':
        os << "\\t";
        break;
      case '\n':
        os << "\\n";
        break;
      case '\r':
        os << "\\r";
        break;
      case '"':
        os << "\\\"";
        break;
      case '\'':
        os << "\\'";
        break;
      case '\\':
        os << "\\\\";
        break;
      default: {
        if (c >= 32 && c < 127) {
          os << c;
        } else {
          os << std::hex << '\\' << (c / 16) << (c % 16) << std::dec;
        }
      }
    }
  }
  return os << '"';
}